

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O3

void __thiscall
google::protobuf::internal::MapFieldAccessor::Swap
          (MapFieldAccessor *this,Field *data,RepeatedFieldAccessor *other_mutator,Field *other_data
          )

{
  LogMessage *other;
  RepeatedPtrFieldBase *this_00;
  RepeatedPtrFieldBase *other_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if ((RepeatedFieldAccessor *)this != other_mutator) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/reflection_internal.h"
               ,0xec);
    other = LogMessage::operator<<(&local_50,"CHECK failed: this == other_mutator: ");
    LogFinisher::operator=(&local_51,other);
    LogMessage::~LogMessage(&local_50);
  }
  this_00 = MapFieldBase::MutableRepeatedField((MapFieldBase *)data);
  other_00 = MapFieldBase::MutableRepeatedField((MapFieldBase *)other_data);
  if (this_00 != other_00) {
    RepeatedPtrFieldBase::
    Swap<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
              (this_00,other_00);
  }
  return;
}

Assistant:

void Swap(Field* data, const internal::RepeatedFieldAccessor* other_mutator,
            Field* other_data) const override {
    GOOGLE_CHECK(this == other_mutator);
    MutableRepeatedField(data)->Swap(MutableRepeatedField(other_data));
  }